

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

ByteData * __thiscall
cfd::SignParameter::ConvertToSignature(ByteData *__return_storage_ptr__,SignParameter *this)

{
  char cVar1;
  CfdException *this_00;
  undefined1 local_58 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  cfd::core::ByteData::ByteData(__return_storage_ptr__);
  if (this->der_encode_ == true) {
    cVar1 = cfd::core::ByteData::Empty();
    if (cVar1 != '\0') {
      local_58._0_8_ = "cfd_transaction_common.cpp";
      local_58._8_4_ = 0x1d6;
      local_58._16_8_ = "ConvertToSignature";
      core::logger::warn<>
                ((CfdSourceLocation *)local_58,"Failed to ConvertToSignature. sign hex empty.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_58,"Invalid hex string. empty sign data.",(allocator *)&local_38);
      core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_();
    cfd::core::CryptoUtil::ConvertSignatureToDer((string *)&local_38,(SigHashType *)local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&__return_storage_ptr__->data_,&local_38);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&__return_storage_ptr__->data_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData SignParameter::ConvertToSignature() const {
  ByteData byte_data;
  if (der_encode_) {
    if (data_.Empty()) {
      warn(CFD_LOG_SOURCE, "Failed to ConvertToSignature. sign hex empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hex string. empty sign data.");
    }
    byte_data =
        CryptoUtil::ConvertSignatureToDer(data_.GetHex(), sighash_type_);
  } else {
    byte_data = data_;
  }
  return byte_data;
}